

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int decode(jpeg *j,huffman *h)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  long in_RSI;
  long in_RDI;
  int k;
  int c;
  uint temp;
  int local_24;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint local_4;
  
  if (*(int *)(in_RDI + 0x36e4) < 0x10) {
    grow_buffer_unsafe((jpeg *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  uVar3 = (uint)*(byte *)(in_RSI + (int)(*(uint *)(in_RDI + 0x36e0) >>
                                         ((char)*(undefined4 *)(in_RDI + 0x36e4) - 9U & 0x1f) &
                                        0x1ff));
  if (uVar3 < 0xff) {
    if (*(int *)(in_RDI + 0x36e4) < (int)(uint)*(byte *)(in_RSI + 0x500 + (long)(int)uVar3)) {
      local_4 = 0xffffffff;
    }
    else {
      *(uint *)(in_RDI + 0x36e4) =
           *(int *)(in_RDI + 0x36e4) - (uint)*(byte *)(in_RSI + 0x500 + (long)(int)uVar3);
      local_4 = (uint)*(byte *)(in_RSI + 0x400 + (long)(int)uVar3);
    }
  }
  else {
    if (*(int *)(in_RDI + 0x36e4) < 0x10) {
      uVar3 = *(int *)(in_RDI + 0x36e0) << (0x10U - (char)*(undefined4 *)(in_RDI + 0x36e4) & 0x1f);
    }
    else {
      uVar3 = *(uint *)(in_RDI + 0x36e0) >> ((char)*(undefined4 *)(in_RDI + 0x36e4) - 0x10U & 0x1f);
    }
    local_24 = 10;
    while (*(uint *)(in_RSI + 0x604 + (long)local_24 * 4) <= (uVar3 & 0xffff)) {
      local_24 = local_24 + 1;
    }
    if (local_24 == 0x11) {
      *(int *)(in_RDI + 0x36e4) = *(int *)(in_RDI + 0x36e4) + -0x10;
      local_4 = 0xffffffff;
    }
    else if (*(int *)(in_RDI + 0x36e4) < local_24) {
      local_4 = 0xffffffff;
    }
    else {
      uVar1 = *(undefined4 *)(in_RDI + 0x36e4);
      uVar3 = bmask[local_24];
      iVar2 = *(int *)(in_RSI + 0x64c + (long)local_24 * 4);
      *(int *)(in_RDI + 0x36e4) = *(int *)(in_RDI + 0x36e4) - local_24;
      local_4 = (uint)*(byte *)(in_RSI + 0x400 +
                               (long)(int)((*(uint *)(in_RDI + 0x36e0) >>
                                            ((char)uVar1 - (char)local_24 & 0x1fU) & uVar3) + iVar2)
                               );
    }
  }
  return local_4;
}

Assistant:

__forceinline static int decode(jpeg *j, huffman *h)
{
   unsigned int temp;
   int c,k;

   if (j->code_bits < 16) grow_buffer_unsafe(j);

   // look at the top FAST_BITS and determine what symbol ID it is,
   // if the code is <= FAST_BITS
   c = (j->code_buffer >> (j->code_bits - FAST_BITS)) & ((1 << FAST_BITS)-1);
   k = h->fast[c];
   if (k < 255) {
      if (h->size[k] > j->code_bits)
         return -1;
      j->code_bits -= h->size[k];
      return h->values[k];
   }

   // naive test is to shift the code_buffer down so k bits are
   // valid, then test against maxcode. To speed this up, we've
   // preshifted maxcode left so that it has (16-k) 0s at the
   // end; in other words, regardless of the number of bits, it
   // wants to be compared against something shifted to have 16;
   // that way we don't need to shift inside the loop.
   if (j->code_bits < 16)
      temp = (j->code_buffer << (16 - j->code_bits)) & 0xffff;
   else
      temp = (j->code_buffer >> (j->code_bits - 16)) & 0xffff;
   for (k=FAST_BITS+1 ; ; ++k)
      if (temp < h->maxcode[k])
         break;
   if (k == 17) {
      // error! code not found
      j->code_bits -= 16;
      return -1;
   }

   if (k > j->code_bits)
      return -1;

   // convert the huffman code to the symbol id
   c = ((j->code_buffer >> (j->code_bits - k)) & bmask[k]) + h->delta[k];
   assert((((j->code_buffer) >> (j->code_bits - h->size[c])) & bmask[h->size[c]]) == h->code[c]);

   // convert the id to a symbol
   j->code_bits -= k;
   return h->values[c];
}